

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

idx_t __thiscall duckdb::Pipeline::UpdateBatchIndex(Pipeline *this,idx_t old_index,idx_t new_index)

{
  _Rb_tree_header *p_Var1;
  idx_t iVar2;
  int iVar3;
  _Base_ptr p_Var4;
  InternalException *pIVar5;
  const_iterator __position;
  string local_58;
  idx_t local_38;
  
  local_38 = new_index;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->batch_lock);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  if (*(ulong *)((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) <=
      new_index) {
    p_Var4 = (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 != (_Base_ptr)0x0) {
      p_Var1 = &(this->batch_indexes)._M_t._M_impl.super__Rb_tree_header;
      __position._M_node = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var4 + 1) >= old_index) {
          __position._M_node = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < old_index];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
         (*(ulong *)(__position._M_node + 1) <= old_index)) {
        ::std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&this->batch_indexes,__position);
        ::std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_equal<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&this->batch_indexes,&local_38);
        iVar2 = *(idx_t *)((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left + 1);
        pthread_mutex_unlock((pthread_mutex_t *)&this->batch_lock);
        return iVar2;
      }
    }
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Batch index %llu was not found in set of active batch indexes",
               "");
    InternalException::InternalException<unsigned_long>(pIVar5,&local_58,old_index);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "Processing batch index %llu, but previous min batch index was %llu","");
  InternalException::InternalException<unsigned_long,unsigned_long>
            (pIVar5,&local_58,new_index,
             *(unsigned_long *)
              ((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t Pipeline::UpdateBatchIndex(idx_t old_index, idx_t new_index) {
	lock_guard<mutex> l(batch_lock);
	if (new_index < *batch_indexes.begin()) {
		throw InternalException("Processing batch index %llu, but previous min batch index was %llu", new_index,
		                        *batch_indexes.begin());
	}
	auto entry = batch_indexes.find(old_index);
	if (entry == batch_indexes.end()) {
		throw InternalException("Batch index %llu was not found in set of active batch indexes", old_index);
	}
	batch_indexes.erase(entry);
	batch_indexes.insert(new_index);
	return *batch_indexes.begin();
}